

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

bool __thiscall jpgd::jpeg_decoder::calc_mcu_block_order(jpeg_decoder *this)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  
  lVar9 = (long)this->m_comps_in_frame;
  if (lVar9 < 1) {
    iVar6 = 0;
    iVar7 = 0;
  }
  else {
    lVar3 = 0;
    iVar6 = 0;
    iVar7 = 0;
    do {
      if (iVar7 < this->m_comp_h_samp[lVar3]) {
        iVar7 = this->m_comp_h_samp[lVar3];
      }
      if (iVar6 < this->m_comp_v_samp[lVar3]) {
        iVar6 = this->m_comp_v_samp[lVar3];
      }
      lVar3 = lVar3 + 1;
    } while (lVar9 != lVar3);
    if (0 < this->m_comps_in_frame) {
      iVar8 = this->m_image_x_size;
      iVar10 = this->m_image_y_size;
      lVar3 = 0;
      do {
        iVar1 = (this->m_comp_h_samp[lVar3] * iVar8 + iVar7 + -1) / iVar7;
        iVar5 = iVar1 + 7;
        iVar1 = iVar1 + 0xe;
        if (-1 < iVar5) {
          iVar1 = iVar5;
        }
        this->m_comp_h_blocks[lVar3] = iVar1 >> 3;
        iVar1 = (this->m_comp_v_samp[lVar3] * iVar10 + iVar6 + -1) / iVar6;
        iVar5 = iVar1 + 7;
        iVar1 = iVar1 + 0xe;
        if (-1 < iVar5) {
          iVar1 = iVar5;
        }
        this->m_comp_v_blocks[lVar3] = iVar1 >> 3;
        lVar3 = lVar3 + 1;
      } while (lVar9 != lVar3);
    }
  }
  iVar8 = this->m_comps_in_scan;
  if (iVar8 == 1) {
    iVar7 = this->m_comp_list[0];
    this->m_mcus_per_row = this->m_comp_h_blocks[iVar7];
    this->m_mcus_per_col = this->m_comp_v_blocks[iVar7];
    this->m_mcu_org[0] = iVar7;
    this->m_blocks_per_mcu = 1;
    uVar2 = 1;
    if (this->m_max_blocks_per_mcu < 1) {
      return false;
    }
  }
  else {
    iVar10 = this->m_image_x_size + 7;
    iVar1 = this->m_image_x_size + 0xe;
    if (-1 < iVar10) {
      iVar1 = iVar10;
    }
    this->m_mcus_per_row = ((iVar1 >> 3) + iVar7 + -1) / iVar7;
    iVar7 = this->m_image_y_size + 7;
    iVar10 = this->m_image_y_size + 0xe;
    if (-1 < iVar7) {
      iVar10 = iVar7;
    }
    this->m_mcus_per_col = (iVar6 + (iVar10 >> 3) + -1) / iVar6;
    this->m_blocks_per_mcu = 0;
    if (iVar8 < 1) {
      uVar2 = 0;
    }
    else {
      lVar9 = 0;
      do {
        iVar7 = this->m_comp_list[lVar9];
        iVar6 = this->m_comp_v_samp[iVar7] * this->m_comp_h_samp[iVar7];
        if (iVar6 != 0) {
          do {
            iVar8 = this->m_blocks_per_mcu;
            this->m_blocks_per_mcu = iVar8 + 1;
            this->m_mcu_org[iVar8] = iVar7;
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
          iVar8 = this->m_comps_in_scan;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar8);
      uVar2 = this->m_blocks_per_mcu;
    }
    if (this->m_max_blocks_per_mcu < (int)uVar2) {
      return false;
    }
    if ((int)uVar2 < 1) {
      return true;
    }
  }
  uVar4 = 0;
  do {
    if (3 < this->m_mcu_org[uVar4]) {
      return false;
    }
    uVar4 = uVar4 + 1;
  } while (uVar2 != uVar4);
  return uVar2 <= uVar4;
}

Assistant:

bool jpeg_decoder::calc_mcu_block_order()
	{
		int component_num, component_id;
		int max_h_samp = 0, max_v_samp = 0;

		for (component_id = 0; component_id < m_comps_in_frame; component_id++)
		{
			if (m_comp_h_samp[component_id] > max_h_samp)
				max_h_samp = m_comp_h_samp[component_id];

			if (m_comp_v_samp[component_id] > max_v_samp)
				max_v_samp = m_comp_v_samp[component_id];
		}

		for (component_id = 0; component_id < m_comps_in_frame; component_id++)
		{
			m_comp_h_blocks[component_id] = ((((m_image_x_size * m_comp_h_samp[component_id]) + (max_h_samp - 1)) / max_h_samp) + 7) / 8;
			m_comp_v_blocks[component_id] = ((((m_image_y_size * m_comp_v_samp[component_id]) + (max_v_samp - 1)) / max_v_samp) + 7) / 8;
		}

		if (m_comps_in_scan == 1)
		{
			m_mcus_per_row = m_comp_h_blocks[m_comp_list[0]];
			m_mcus_per_col = m_comp_v_blocks[m_comp_list[0]];
		}
		else
		{
			m_mcus_per_row = (((m_image_x_size + 7) / 8) + (max_h_samp - 1)) / max_h_samp;
			m_mcus_per_col = (((m_image_y_size + 7) / 8) + (max_v_samp - 1)) / max_v_samp;
		}

		if (m_comps_in_scan == 1)
		{
			m_mcu_org[0] = m_comp_list[0];

			m_blocks_per_mcu = 1;
		}
		else
		{
			m_blocks_per_mcu = 0;

			for (component_num = 0; component_num < m_comps_in_scan; component_num++)
			{
				int num_blocks;

				component_id = m_comp_list[component_num];

				num_blocks = m_comp_h_samp[component_id] * m_comp_v_samp[component_id];

				while (num_blocks--)
					m_mcu_org[m_blocks_per_mcu++] = component_id;
			}
		}

		if (m_blocks_per_mcu > m_max_blocks_per_mcu)
			return false;

		for (int mcu_block = 0; mcu_block < m_blocks_per_mcu; mcu_block++)
		{
			int comp_id = m_mcu_org[mcu_block];
			if (comp_id >= JPGD_MAX_QUANT_TABLES)
				return false;
		}

		return true;
	}